

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  ulong uVar1;
  uint64_t *puVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  uhugeint_t local_68;
  uhugeint_t local_58;
  idx_t local_40;
  bool *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 0;
      iVar11 = 0;
      do {
        puVar2 = (uint64_t *)((long)&ldata->lower + lVar7);
        local_58.lower = *puVar2;
        local_58.upper = puVar2[1];
        puVar2 = (uint64_t *)((long)&rdata->lower + lVar7);
        local_68.lower = *puVar2;
        local_68.upper = puVar2[1];
        bVar6 = uhugeint_t::operator>(&local_68,&local_58);
        result_data[iVar11] = !bVar6;
        iVar11 = iVar11 + 1;
        lVar7 = lVar7 + 0x10;
      } while (count != iVar11);
    }
  }
  else {
    uVar1 = count + 0x3f;
    if (0x3f < uVar1) {
      uVar8 = 0;
      uVar9 = 0;
      local_40 = count;
      do {
        puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          uVar10 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar10 = count;
          }
LAB_01374645:
          uVar5 = uVar8;
          if (uVar8 < uVar10) {
            lVar7 = uVar8 << 4;
            do {
              puVar2 = (uint64_t *)((long)&ldata->lower + lVar7);
              local_58.lower = *puVar2;
              local_58.upper = puVar2[1];
              puVar2 = (uint64_t *)((long)&rdata->lower + lVar7);
              local_68.lower = *puVar2;
              local_68.upper = puVar2[1];
              bVar6 = uhugeint_t::operator>(&local_68,&local_58);
              result_data[uVar8] = !bVar6;
              uVar8 = uVar8 + 1;
              lVar7 = lVar7 + 0x10;
              uVar5 = uVar10;
            } while (uVar10 != uVar8);
          }
        }
        else {
          uVar4 = puVar3[uVar9];
          uVar10 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar10 = count;
          }
          uVar5 = uVar10;
          if (uVar4 != 0) {
            if (uVar4 == 0xffffffffffffffff) goto LAB_01374645;
            uVar5 = uVar8;
            if (uVar8 < uVar10) {
              local_38 = result_data + uVar8;
              lVar7 = uVar8 << 4;
              uVar12 = 0;
              do {
                if ((uVar4 >> (uVar12 & 0x3f) & 1) != 0) {
                  puVar2 = (uint64_t *)((long)&ldata->lower + lVar7);
                  local_58.lower = *puVar2;
                  local_58.upper = puVar2[1];
                  puVar2 = (uint64_t *)((long)&rdata->lower + lVar7);
                  local_68.lower = *puVar2;
                  local_68.upper = puVar2[1];
                  bVar6 = uhugeint_t::operator>(&local_68,&local_58);
                  local_38[uVar12] = !bVar6;
                }
                uVar12 = uVar12 + 1;
                lVar7 = lVar7 + 0x10;
                uVar5 = uVar10;
                count = local_40;
              } while (uVar10 - uVar8 != uVar12);
            }
          }
        }
        uVar8 = uVar5;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1 >> 6);
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}